

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O2

int saxTest(char *filename,size_t limit,int options,int fail)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long lVar3;
  char *__format;
  int iVar4;
  
  nb_tests = nb_tests + 1;
  maxlen = limit;
  puVar2 = (undefined8 *)xmlNewParserCtxt();
  if (puVar2 == (undefined8 *)0x0) {
    fwrite("Failed to create parser context\n",0x20,1,_stderr);
    return 1;
  }
  uVar1 = *puVar2;
  *puVar2 = &callbackSAX2HandlerStruct;
  puVar2[1] = 0;
  iVar4 = 0;
  lVar3 = xmlCtxtReadFile(puVar2,filename,0,options);
  if (lVar3 == 0) {
    iVar4 = 0;
    if (*(int *)(puVar2 + 3) == 0) {
      if (fail != 0) goto LAB_001031aa;
      __format = "Failed to parse \'%s\' %lu\n";
    }
    else {
      if (fail == 0) goto LAB_001031aa;
      __format = "Failed to get failure for \'%s\' %lu\n";
    }
    fprintf(_stderr,__format,filename,limit);
    iVar4 = 1;
  }
  else {
    fwrite("SAX parsing generated a document !\n",0x23,1,_stderr);
    xmlFreeDoc(lVar3);
  }
LAB_001031aa:
  *puVar2 = uVar1;
  xmlFreeParserCtxt(puVar2);
  return iVar4;
}

Assistant:

static int
saxTest(const char *filename, size_t limit, int options, int fail) {
    int res = 0;
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    xmlSAXHandlerPtr old_sax;

    nb_tests++;

    maxlen = limit;
    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL) {
        fprintf(stderr, "Failed to create parser context\n");
	return(1);
    }
    old_sax = ctxt->sax;
    ctxt->sax = callbackSAX2Handler;
    ctxt->userData = NULL;
    doc = xmlCtxtReadFile(ctxt, filename, NULL, options);

    if (doc != NULL) {
        fprintf(stderr, "SAX parsing generated a document !\n");
        xmlFreeDoc(doc);
        res = 0;
    } else if (ctxt->wellFormed == 0) {
        if (fail)
            res = 0;
        else {
            fprintf(stderr, "Failed to parse '%s' %lu\n", filename,
                    (unsigned long) limit);
            res = 1;
        }
    } else {
        if (fail) {
            fprintf(stderr, "Failed to get failure for '%s' %lu\n",
                    filename, (unsigned long) limit);
            res = 1;
        } else
            res = 0;
    }
    ctxt->sax = old_sax;
    xmlFreeParserCtxt(ctxt);

    return(res);
}